

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::HasStringPieceFields(Descriptor *descriptor,Options *options)

{
  long lVar1;
  once_flag *__once;
  bool bVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  
  bVar3 = 0 < *(int *)(descriptor + 0x68);
  if (0 < *(int *)(descriptor + 0x68)) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      lVar1 = *(long *)(descriptor + 0x28);
      __once = *(once_flag **)(lVar1 + 0x30 + lVar5);
      if (__once != (once_flag *)0x0) {
        local_40 = (FieldDescriptor *)(lVar1 + lVar5);
        local_38 = FieldDescriptor::TypeOnceInit;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (__once,&local_38,&local_40);
      }
      if (((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar1 + 0x38 + lVar5) * 4
                    ) == 9) && (options->opensource_runtime == false)) &&
         (*(int *)(*(long *)(lVar1 + 0x78 + lVar5) + 0x48) == 2)) {
        if (bVar3) {
          return true;
        }
        break;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x98;
      bVar3 = lVar4 < *(int *)(descriptor + 0x68);
    } while (lVar4 < *(int *)(descriptor + 0x68));
  }
  bVar3 = 0 < *(int *)(descriptor + 0x70);
  if ((0 < *(int *)(descriptor + 0x70)) &&
     (bVar2 = HasStringPieceFields(*(Descriptor **)(descriptor + 0x38),options), !bVar2)) {
    lVar5 = 0;
    lVar4 = 0x90;
    do {
      lVar5 = lVar5 + 1;
      bVar3 = lVar5 < *(int *)(descriptor + 0x70);
      if (*(int *)(descriptor + 0x70) <= lVar5) {
        return bVar3;
      }
      bVar2 = HasStringPieceFields((Descriptor *)(lVar4 + *(long *)(descriptor + 0x38)),options);
      lVar4 = lVar4 + 0x90;
    } while (!bVar2);
  }
  return bVar3;
}

Assistant:

static bool HasStringPieceFields(const Descriptor* descriptor,
                                 const Options& options) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    if (IsStringPieceField(descriptor->field(i), options)) return true;
  }
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    if (HasStringPieceFields(descriptor->nested_type(i), options)) return true;
  }
  return false;
}